

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O2

void absl::lts_20250127::raw_log_internal::RawLog
               (LogSeverity severity,char *file,int line,char *format,...)

{
  bool bVar1;
  char *pcVar2;
  char in_AL;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *buf;
  va_list ap;
  char buffer [3000];
  uint local_cc4;
  char *local_cc0;
  undefined8 local_cb8;
  char **local_cb0;
  undefined1 *local_ca8;
  undefined1 local_c98 [32];
  undefined8 local_c78;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c58;
  undefined8 local_c48;
  undefined8 local_c38;
  undefined8 local_c28;
  undefined8 local_c18;
  undefined8 local_c08;
  undefined8 local_bf8;
  char local_be8 [3000];
  
  local_ca8 = local_c98;
  if (in_AL != '\0') {
    local_c68 = in_XMM0_Qa;
    local_c58 = in_XMM1_Qa;
    local_c48 = in_XMM2_Qa;
    local_c38 = in_XMM3_Qa;
    local_c28 = in_XMM4_Qa;
    local_c18 = in_XMM5_Qa;
    local_c08 = in_XMM6_Qa;
    local_bf8 = in_XMM7_Qa;
  }
  local_cb0 = &buf;
  local_cb8 = 0x3000000020;
  local_cc4 = 3000;
  local_cc0 = local_be8;
  local_c78 = in_R8;
  local_c70 = in_R9;
  cVar3 = (*(code *)(anonymous_namespace)::log_filter_and_prefix_hook)();
  pcVar2 = local_cc0;
  if (cVar3 == '\0') goto LAB_002936ec;
  if ((long)(int)local_cc4 < 0) {
LAB_002936bd:
    anon_unknown_0::DoRawLog(&local_cc0,(int *)&local_cc4,"%s"," ... (message truncated)\n");
  }
  else {
    iVar4 = vsnprintf(local_cc0,(long)(int)local_cc4,format,&local_cb8);
    iVar6 = local_cc4 - 0x1a;
    if (local_cc4 < 0x1a) {
      iVar6 = 0;
    }
    if (iVar4 <= (int)local_cc4 && iVar4 >= 0) {
      iVar6 = iVar4;
    }
    uVar5 = local_cc4 - iVar6;
    local_cc0 = local_cc0 + iVar6;
    bVar1 = (int)local_cc4 < iVar4;
    local_cc4 = uVar5;
    if (bVar1 || iVar4 < 0) goto LAB_002936bd;
    anon_unknown_0::DoRawLog(&local_cc0,(int *)&local_cc4,"\n");
  }
  AsyncSignalSafeWriteError(local_be8,(long)local_cc0 - (long)local_be8);
LAB_002936ec:
  if (severity != kFatal) {
    return;
  }
  (*(code *)(anonymous_namespace)::abort_hook)(file,line,local_be8,pcVar2,&stack0xffffffffffffffd0);
  abort();
}

Assistant:

void RawLog(absl::LogSeverity severity, const char* file, int line,
            const char* format, ...) {
  va_list ap;
  va_start(ap, format);
  RawLogVA(severity, file, line, format, ap);
  va_end(ap);
}